

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

int __thiscall zmq::address_t::to_string(address_t *this,string *addr_)

{
  udp_address_t *puVar1;
  int iVar2;
  ostream *poVar3;
  stringstream s;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  iVar2 = std::__cxx11::string::compare((char *)this);
  if ((iVar2 == 0) && ((this->resolved).tcp_addr != (tcp_address_t *)0x0)) {
    iVar2 = tcp_address_t::to_string((this->resolved).tcp_addr,addr_);
    return iVar2;
  }
  iVar2 = std::__cxx11::string::compare((char *)this);
  if ((iVar2 == 0) && (puVar1 = (this->resolved).udp_addr, puVar1 != (udp_address_t *)0x0)) {
    iVar2 = (*puVar1->_vptr_udp_address_t[2])(puVar1,addr_);
    return iVar2;
  }
  iVar2 = std::__cxx11::string::compare((char *)this);
  if ((iVar2 == 0) && ((this->resolved).ipc_addr != (ipc_address_t *)0x0)) {
    iVar2 = ipc_address_t::to_string((this->resolved).ipc_addr,addr_);
    return iVar2;
  }
  iVar2 = std::__cxx11::string::compare((char *)this);
  if ((iVar2 == 0) && ((this->resolved).tipc_addr != (tipc_address_t *)0x0)) {
    iVar2 = tipc_address_t::to_string((this->resolved).tipc_addr,addr_);
    return iVar2;
  }
  if (((this->protocol)._M_string_length == 0) || ((this->address)._M_string_length == 0)) {
    addr_->_M_string_length = 0;
    *(addr_->_M_dataplus)._M_p = '\0';
    iVar2 = -1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,(this->protocol)._M_dataplus._M_p,
                        (this->protocol)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"://",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->address)._M_dataplus._M_p,(this->address)._M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)addr_,(string *)local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int zmq::address_t::to_string (std::string &addr_) const
{
    if (protocol == protocol_name::tcp && resolved.tcp_addr)
        return resolved.tcp_addr->to_string (addr_);
    if (protocol == protocol_name::udp && resolved.udp_addr)
        return resolved.udp_addr->to_string (addr_);
#ifdef ZMQ_HAVE_WS
    if (protocol == protocol_name::ws && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#ifdef ZMQ_HAVE_WSS
    if (protocol == protocol_name::wss && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_IPC
    if (protocol == protocol_name::ipc && resolved.ipc_addr)
        return resolved.ipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_TIPC
    if (protocol == protocol_name::tipc && resolved.tipc_addr)
        return resolved.tipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_VMCI
    if (protocol == protocol_name::vmci && resolved.vmci_addr)
        return resolved.vmci_addr->to_string (addr_);
#endif

    if (!protocol.empty () && !address.empty ()) {
        std::stringstream s;
        s << protocol << "://" << address;
        addr_ = s.str ();
        return 0;
    }
    addr_.clear ();
    return -1;
}